

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O2

Aig_Obj_t *
Dar_BalanceBuildSuperTop
          (Aig_Man_t *p,Vec_Ptr_t *vSuper,Aig_Type_t Type,int fUpdateLevel,int nLutSize)

{
  int iVar1;
  Vec_Ptr_t *vSuper_00;
  Aig_Obj_t *pAVar2;
  int iVar3;
  int i;
  
  if (vSuper->nSize < 2) {
    __assert_fail("vSuper->nSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darBalance.c"
                  ,0x1cf,
                  "Aig_Obj_t *Dar_BalanceBuildSuperTop(Aig_Man_t *, Vec_Ptr_t *, Aig_Type_t, int, int)"
                 );
  }
  Vec_PtrSort(vSuper,Aig_NodeCompareLevelsDecrease);
  do {
    if (vSuper->nSize < 2) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,0);
      return pAVar2;
    }
    vSuper_00 = Vec_PtrAlloc(nLutSize);
    i = vSuper->nSize;
    iVar3 = 0;
    while (0 < i) {
      i = i + -1;
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,i);
      iVar1 = Aig_BaseSize(p,pAVar2,nLutSize);
      iVar3 = iVar3 + iVar1;
      if ((nLutSize < iVar3) && (iVar1 = vSuper_00->nSize, 1 < iVar1)) goto LAB_0041f9af;
      Vec_PtrPush(vSuper_00,pAVar2);
    }
    iVar1 = vSuper_00->nSize;
LAB_0041f9af:
    Vec_PtrShrink(vSuper,vSuper->nSize - iVar1);
    pAVar2 = Dar_BalanceBuildSuper(p,vSuper_00,Type,fUpdateLevel);
    Vec_PtrFree(vSuper_00);
    Dar_BalancePushUniqueOrderByLevel(vSuper,pAVar2,(uint)(Type == AIG_OBJ_EXOR));
  } while( true );
}

Assistant:

Aig_Obj_t * Dar_BalanceBuildSuperTop( Aig_Man_t * p, Vec_Ptr_t * vSuper, Aig_Type_t Type, int fUpdateLevel, int nLutSize )
{
    Vec_Ptr_t * vSubset;
    Aig_Obj_t * pObj;
    int i, nBaseSizeAll, nBaseSize;
    assert( vSuper->nSize > 1 );
    // sort the new nodes by level in the decreasing order
    Vec_PtrSort( vSuper, (int (*)(void))Aig_NodeCompareLevelsDecrease );
    // add one LUT at a time
    while ( Vec_PtrSize(vSuper) > 1 )
    {
        // isolate the group of nodes with nLutSize inputs
        nBaseSizeAll = 0;
        vSubset = Vec_PtrAlloc( nLutSize );
        Vec_PtrForEachEntryReverse( Aig_Obj_t *, vSuper, pObj, i )
        {
            nBaseSize = Aig_BaseSize( p, pObj, nLutSize );
            if ( nBaseSizeAll + nBaseSize > nLutSize && Vec_PtrSize(vSubset) > 1 )
                break;
            nBaseSizeAll += nBaseSize;
            Vec_PtrPush( vSubset, pObj );
        }
        // remove them from vSuper
        Vec_PtrShrink( vSuper, Vec_PtrSize(vSuper) - Vec_PtrSize(vSubset) );
        // create the new supergate
        pObj = Dar_BalanceBuildSuper( p, vSubset, Type, fUpdateLevel );
        Vec_PtrFree( vSubset );
        // add the new output
        Dar_BalancePushUniqueOrderByLevel( vSuper, pObj, Type == AIG_OBJ_EXOR );
    }
    return (Aig_Obj_t *)Vec_PtrEntry(vSuper, 0);
}